

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

void __thiscall miniros::Publication::peerConnect(Publication *this,SubscriberLinkPtr *sub_link)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool *in_RDI;
  CallbackInterfacePtr cb;
  SubscriberCallbacksPtr *cbs;
  iterator end;
  iterator it;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff68;
  function<void_(const_miniros::SingleSubscriberPublisher_&)> *in_stack_ffffffffffffff70;
  bool *__args_3;
  shared_ptr<miniros::SubscriberLink> *in_stack_ffffffffffffffa0;
  function<void_(const_miniros::SingleSubscriberPublisher_&)> *in_stack_ffffffffffffffa8;
  mutex_type local_50;
  shared_ptr<miniros::SubscriberCallbacks> *local_28;
  __normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
  local_20 [4];
  
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_20[0]._M_current =
       (shared_ptr<miniros::SubscriberCallbacks> *)
       std::
       vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
       ::begin((vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
                *)in_stack_ffffffffffffff68);
  local_28 = (shared_ptr<miniros::SubscriberCallbacks> *)
             std::
             vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
             ::end((vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
                    *)in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
                             *)in_stack_ffffffffffffff70,
                            (__normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
                             *)in_stack_ffffffffffffff68), bVar1) {
    local_50.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
         ::operator*(local_20);
    std::__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4890b5);
    bVar1 = std::function::operator_cast_to_bool(in_stack_ffffffffffffff70);
    if ((bVar1) &&
       (peVar2 = std::
                 __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4890d0), peVar2->callback_queue_ != (CallbackQueueInterface *)0x0
       )) {
      std::
      __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4890e5);
      peVar2 = std::
               __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x489101);
      __args_3 = &peVar2->has_tracked_object_;
      std::
      __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x489114);
      std::
      make_shared<miniros::PeerConnDisconnCallback,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::shared_ptr<miniros::SubscriberLink>const&,bool&,std::weak_ptr<void_const>&>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_RDI,
                 (weak_ptr<const_void> *)__args_3);
      in_stack_ffffffffffffff68 = &local_50;
      std::shared_ptr<miniros::CallbackInterface>::shared_ptr<miniros::PeerConnDisconnCallback,void>
                ((shared_ptr<miniros::CallbackInterface> *)in_stack_ffffffffffffff70,
                 (shared_ptr<miniros::PeerConnDisconnCallback> *)in_stack_ffffffffffffff68);
      std::shared_ptr<miniros::PeerConnDisconnCallback>::~shared_ptr
                ((shared_ptr<miniros::PeerConnDisconnCallback> *)0x489157);
      peVar2 = std::
               __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x489161);
      in_stack_ffffffffffffff70 =
           (function<void_(const_miniros::SingleSubscriberPublisher_&)> *)peVar2->callback_queue_;
      peVar3 = std::__shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2> *)
                          local_50.super___mutex_base._M_mutex.__data.__list.__next);
      (*(code *)(*(shared_ptr<miniros::SubscriberCallbacks> **)
                  &(in_stack_ffffffffffffff70->super__Function_base)._M_functor)[1].
                super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                (in_stack_ffffffffffffff70,
                 (undefined1 *)((long)&local_50.super___mutex_base._M_mutex + 0x10),peVar3);
      std::shared_ptr<miniros::CallbackInterface>::~shared_ptr
                ((shared_ptr<miniros::CallbackInterface> *)0x489196);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
    ::operator++(local_20);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4891e0);
  return;
}

Assistant:

void Publication::peerConnect(const SubscriberLinkPtr& sub_link)
{
  std::scoped_lock<std::mutex> lock(callbacks_mutex_);

  V_Callback::iterator it = callbacks_.begin();
  V_Callback::iterator end = callbacks_.end();
  for (; it != end; ++it)
  {
    const SubscriberCallbacksPtr& cbs = *it;
    if (cbs->connect_ && cbs->callback_queue_)
    {
      CallbackInterfacePtr cb(std::make_shared<PeerConnDisconnCallback>(cbs->connect_, sub_link, cbs->has_tracked_object_, cbs->tracked_object_));
      cbs->callback_queue_->addCallback(cb, (uint64_t)cbs.get());
    }
  }
}